

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O3

void __thiscall
sptk::reaper::LpcAnalyzer::Autoc(LpcAnalyzer *this,int windowsize,float *s,int p,float *r,float *e)

{
  float *pfVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (windowsize == 0) {
    *r = 1.0;
  }
  else {
    fVar6 = 0.0;
    lVar3 = 0;
    do {
      fVar6 = fVar6 + s[lVar3] * s[lVar3];
      lVar3 = lVar3 + 1;
    } while (windowsize != (int)lVar3);
    *r = 1.0;
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      fVar5 = fVar6 / (float)windowsize;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      *e = fVar5;
      if (p < 1) {
        return;
      }
      pfVar1 = s + 1;
      iVar2 = windowsize + -1;
      uVar4 = 1;
      do {
        fVar5 = 0.0;
        if (windowsize != (int)uVar4) {
          lVar3 = 0;
          do {
            fVar5 = fVar5 + s[lVar3] * pfVar1[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 != (int)lVar3);
        }
        r[1] = fVar5 * (1.0 / fVar6);
        r = r + 1;
        uVar4 = uVar4 + 1;
        pfVar1 = pfVar1 + 1;
        iVar2 = iVar2 + -1;
      } while (uVar4 != p + 1);
      return;
    }
  }
  *e = 1.0;
  if (p < 1) {
    return;
  }
  memset(r + 1,0,(ulong)(uint)p << 2);
  return;
}

Assistant:

void LpcAnalyzer::Autoc(int windowsize, float* s, int p, float* r, float* e) {
  int i, j;
  float *q, *t, sum, sum0;

  for (i = windowsize, q = s, sum0 = 0.0; i--;) {
    sum = *q++;
    sum0 += sum*sum;
  }
  *r = 1.;                      /* r[0] will always = 1.0 */
  if (sum0 == 0.0) {            /* No energy: fake low-energy white noise. */
    *e = 1.;                    /* Arbitrarily assign 1 to rms. */
    /* Now fake autocorrelation of white noise. */
    for (i = 1; i <= p; i++) {
      r[i] = 0.;
    }
    return;
  }
  *e = sqrt(sum0 / windowsize);
  sum0 = 1.0 / sum0;
  for (i = 1; i <= p; i++) {
    for (sum = 0.0, j = windowsize - i, q = s, t = s + i; j--;)
      sum += (*q++) * (*t++);
    *(++r) = sum * sum0;  // normalizing by the inverse energy
  }
}